

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::switch_statement::~switch_statement(switch_statement *this)

{
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__switch_statement_001c5840;
  std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::~vector(&this->cl_);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->e_);
  syntax_node::~syntax_node((syntax_node *)this);
  return;
}

Assistant:

explicit switch_statement(const source_extend& extend, expression_ptr&& e, clause_list&& cl) : statement(extend), e_(std::move(e)), cl_(std::move(cl)) {
        assert(e_);
    }